

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

NType duckdb::Node::GetNodeType(idx_t count)

{
  idx_t count_local;
  undefined1 local_1;
  
  if (count < 5) {
    local_1 = NODE_4;
  }
  else if (count < 0x11) {
    local_1 = NODE_16;
  }
  else if (count < 0x31) {
    local_1 = NODE_48;
  }
  else {
    local_1 = NODE_256;
  }
  return local_1;
}

Assistant:

NType Node::GetNodeType(idx_t count) {
	if (count <= Node4::CAPACITY) {
		return NType::NODE_4;
	} else if (count <= Node16::CAPACITY) {
		return NType::NODE_16;
	} else if (count <= Node48::CAPACITY) {
		return NType::NODE_48;
	}
	return NType::NODE_256;
}